

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_types.h
# Opt level: O0

MicroPropsGenerator * __thiscall
icu_63::number::impl::MicroPropsGenerator::operator=
          (MicroPropsGenerator *this,MicroPropsGenerator *param_1)

{
  MicroPropsGenerator *param_1_local;
  MicroPropsGenerator *this_local;
  
  return this;
}

Assistant:

class U_I18N_API MicroPropsGenerator {
  public:
    virtual ~MicroPropsGenerator();

    /**
     * Considers the given {@link DecimalQuantity}, optionally mutates it, and returns a {@link MicroProps}.
     *
     * @param quantity
     *            The quantity for consideration and optional mutation.
     * @param micros
     *            The MicroProps instance to populate.
     * @return A MicroProps instance resolved for the quantity.
     */
    virtual void processQuantity(DecimalQuantity& quantity, MicroProps& micros,
                                 UErrorCode& status) const = 0;
}